

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdAddCombinePubkey(void *handle,void *combine_handle,char *pubkey)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_61;
  undefined1 local_60 [32];
  Pubkey key;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_60,"CombinePubkey",(allocator *)&key);
  cfd::capi::CheckBuffer(combine_handle,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    local_60._0_8_ = "cfdcapi_key.cpp";
    local_60._8_4_ = 0x543;
    local_60._16_8_ = "CfdAddCombinePubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_60,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_60,"Failed to parameter. pubkey is null or empty.",(allocator *)&key)
    ;
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)combine_handle + 0x10) != 0) {
    std::__cxx11::string::string((string *)local_60,pubkey,&local_61);
    cfd::core::Pubkey::Pubkey(&key,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    this = *(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)
            ((long)combine_handle + 0x10);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_60,&key);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    return 0;
  }
  local_60._0_8_ = "cfdcapi_key.cpp";
  local_60._8_4_ = 0x54c;
  local_60._16_8_ = "CfdAddCombinePubkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_60,"pubkey_list is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_60,"Failed to parameter. pubkey_list is null.",(allocator *)&key);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_60);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddCombinePubkey(
    void* handle, void* combine_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(combine_handle, kPrefixCombinePubkey);
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    CfdCapiCombinePubkey* buffer =
        static_cast<CfdCapiCombinePubkey*>(combine_handle);
    if (buffer->pubkey_list == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey_list is null.");
    }
    Pubkey key(pubkey);
    buffer->pubkey_list->push_back(key.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}